

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_read_close_twice_open_fd.c
# Opt level: O2

void test_archive_read_close_twice_open_fd(void)

{
  int iVar1;
  archive *_a;
  char *pcVar2;
  
  _a = archive_read_new();
  iVar1 = archive_read_support_format_empty(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L' ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_empty(a)",
                      (void *)0x0);
  iVar1 = archive_read_open_fd(_a,0,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L'!',0,"ARCHIVE_OK",(long)iVar1,"archive_read_open_fd(a, 0, 0)",(void *)0x0);
  iVar1 = archive_errno(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L'\"',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
             ,L'#',(char *)0x0,"NULL",pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L'%',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_errno(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L'&',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
             ,L'\'',(char *)0x0,"NULL",pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_close(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L')',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  iVar1 = archive_errno(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L'*',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar2 = archive_error_string(_a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
             ,L'+',(char *)0x0,"NULL",pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  iVar1 = archive_read_free(_a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_read_close_twice_open_fd.c"
                      ,L'-',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_read_close_twice_open_fd)
{
	struct archive* a = archive_read_new();

	assertEqualInt(ARCHIVE_OK, archive_read_support_format_empty(a));
	assertEqualInt(ARCHIVE_OK, archive_read_open_fd(a, 0, 0));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}